

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O1

yajl_tok yajl_lex_peek(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t offset)

{
  uint uVar1;
  size_t sVar2;
  yajl_tok yVar3;
  size_t len;
  size_t outLen;
  uchar *outBuf;
  size_t local_48;
  size_t local_40;
  uchar *local_38;
  
  local_48 = offset;
  len = yajl_buf_len(lexer->buf);
  sVar2 = lexer->bufOff;
  uVar1 = lexer->bufInUse;
  yVar3 = yajl_lex_lex(lexer,jsonText,jsonTextLen,&local_48,&local_38,&local_40);
  lexer->bufOff = sVar2;
  lexer->bufInUse = uVar1;
  yajl_buf_truncate(lexer->buf,len);
  return yVar3;
}

Assistant:

yajl_tok yajl_lex_peek(yajl_lexer lexer, const unsigned char * jsonText,
                       size_t jsonTextLen, size_t offset)
{
    const unsigned char * outBuf;
    size_t outLen;
    size_t bufLen = yajl_buf_len(lexer->buf);
    size_t bufOff = lexer->bufOff;
    unsigned int bufInUse = lexer->bufInUse;
    yajl_tok tok;

    tok = yajl_lex_lex(lexer, jsonText, jsonTextLen, &offset,
                       &outBuf, &outLen);

    lexer->bufOff = bufOff;
    lexer->bufInUse = bufInUse;
    yajl_buf_truncate(lexer->buf, bufLen);

    return tok;
}